

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O1

path * __thiscall boost::filesystem::path::assign<char*>(path *this,char *begin,char *end)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> seq;
  long *local_38 [2];
  long local_28 [2];
  
  (this->m_pathname)._M_string_length = 0;
  *(this->m_pathname)._M_dataplus._M_p = '\0';
  if (begin != end) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>((string *)local_38);
    if (local_38[0] == (long *)0x0) {
      __assert_fail("from",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/filesystem/path_traits.hpp"
                    ,0xc2,
                    "void boost::filesystem::path_traits::convert(const char *, const char *, std::string &)"
                   );
    }
    std::__cxx11::string::replace
              ((ulong)this,(this->m_pathname)._M_string_length,(char *)0x0,(ulong)local_38[0]);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return this;
}

Assistant:

path& assign(InputIterator begin, InputIterator end)
    {
      m_pathname.clear();
      if (begin != end)
      {
        std::basic_string<typename std::iterator_traits<InputIterator>::value_type>
          seq(begin, end);
        path_traits::convert(seq.c_str(), seq.c_str()+seq.size(), m_pathname);
      }
      return *this;
    }